

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::V0LayerParameter::ByteSizeLong(V0LayerParameter *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  V0LayerParameter_PoolMethod value;
  int32 iVar5;
  uint32 uVar6;
  UnknownFieldSet *unknown_fields;
  BlobProto *value_00;
  size_t sVar7;
  size_t sVar8;
  string *psVar9;
  int cached_size;
  size_t data_size_1;
  uint count_2;
  size_t data_size;
  uint local_80;
  uint count_1;
  uint i;
  uint count;
  size_t total_size;
  V0LayerParameter *this_local;
  
  _i = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = V0LayerParameter::unknown_fields(this);
    _i = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar2 = blobs_size(this);
  _i = (ulong)uVar2 * 2 + _i;
  for (local_80 = 0; local_80 < uVar2; local_80 = local_80 + 1) {
    value_00 = blobs(this,local_80);
    sVar7 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::BlobProto>
                      (value_00);
    _i = sVar7 + _i;
  }
  uVar2 = blobs_lr_size(this);
  iVar3 = blobs_lr_size(this);
  sVar7 = google::protobuf::internal::FromIntSize(iVar3);
  uVar4 = weight_decay_size(this);
  iVar3 = weight_decay_size(this);
  sVar8 = google::protobuf::internal::FromIntSize(iVar3);
  _i = (ulong)uVar4 * 4 + sVar8 * 2 + (ulong)uVar2 * 4 + sVar7 * 2 + _i;
  if (((this->_has_bits_).has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar9 = name_abi_cxx11_(this);
      sVar7 = google::protobuf::internal::WireFormatLite::StringSize(psVar9);
      _i = sVar7 + 1 + _i;
    }
    bVar1 = has_type(this);
    if (bVar1) {
      psVar9 = type_abi_cxx11_(this);
      sVar7 = google::protobuf::internal::WireFormatLite::StringSize(psVar9);
      _i = sVar7 + 1 + _i;
    }
    bVar1 = has_source(this);
    if (bVar1) {
      psVar9 = source_abi_cxx11_(this);
      sVar7 = google::protobuf::internal::WireFormatLite::StringSize(psVar9);
      _i = sVar7 + 2 + _i;
    }
    bVar1 = has_meanfile(this);
    if (bVar1) {
      psVar9 = meanfile_abi_cxx11_(this);
      sVar7 = google::protobuf::internal::WireFormatLite::StringSize(psVar9);
      _i = sVar7 + 2 + _i;
    }
    bVar1 = has_det_crop_mode(this);
    if (bVar1) {
      psVar9 = det_crop_mode_abi_cxx11_(this);
      sVar7 = google::protobuf::internal::WireFormatLite::StringSize(psVar9);
      _i = sVar7 + 2 + _i;
    }
    bVar1 = has_weight_filler(this);
    if (bVar1) {
      sVar7 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<caffe::FillerParameter>(this->weight_filler_);
      _i = sVar7 + 1 + _i;
    }
    bVar1 = has_bias_filler(this);
    if (bVar1) {
      sVar7 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<caffe::FillerParameter>(this->bias_filler_);
      _i = sVar7 + 1 + _i;
    }
    bVar1 = has_hdf5_output_param(this);
    if (bVar1) {
      sVar7 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<caffe::HDF5OutputParameter>(this->hdf5_output_param_);
      _i = sVar7 + 2 + _i;
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 0xff00) != 0) {
    bVar1 = has_num_output(this);
    if (bVar1) {
      uVar6 = num_output(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar6);
      _i = sVar7 + 1 + _i;
    }
    bVar1 = has_pad(this);
    if (bVar1) {
      uVar6 = pad(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar6);
      _i = sVar7 + 1 + _i;
    }
    bVar1 = has_kernelsize(this);
    if (bVar1) {
      uVar6 = kernelsize(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar6);
      _i = sVar7 + 1 + _i;
    }
    bVar1 = has_pool(this);
    if (bVar1) {
      value = pool(this);
      sVar7 = google::protobuf::internal::WireFormatLite::EnumSize(value);
      _i = sVar7 + 1 + _i;
    }
    bVar1 = has_batchsize(this);
    if (bVar1) {
      uVar6 = batchsize(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar6);
      _i = sVar7 + 2 + _i;
    }
    bVar1 = has_cropsize(this);
    if (bVar1) {
      uVar6 = cropsize(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar6);
      _i = sVar7 + 2 + _i;
    }
    bVar1 = has_new_width(this);
    if (bVar1) {
      iVar5 = new_width(this);
      sVar7 = google::protobuf::internal::WireFormatLite::Int32Size(iVar5);
      _i = sVar7 + 2 + _i;
    }
    bVar1 = has_mirror(this);
    if (bVar1) {
      _i = _i + 3;
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 0xff0000) != 0) {
    bVar1 = has_shuffle_images(this);
    if (bVar1) {
      _i = _i + 3;
    }
    bVar1 = has_rand_skip(this);
    if (bVar1) {
      uVar6 = rand_skip(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar6);
      _i = sVar7 + 2 + _i;
    }
    bVar1 = has_det_context_pad(this);
    if (bVar1) {
      uVar6 = det_context_pad(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar6);
      _i = sVar7 + 2 + _i;
    }
    bVar1 = has_new_num(this);
    if (bVar1) {
      iVar5 = new_num(this);
      sVar7 = google::protobuf::internal::WireFormatLite::Int32Size(iVar5);
      _i = sVar7 + 2 + _i;
    }
    bVar1 = has_new_channels(this);
    if (bVar1) {
      iVar5 = new_channels(this);
      sVar7 = google::protobuf::internal::WireFormatLite::Int32Size(iVar5);
      _i = sVar7 + 2 + _i;
    }
    bVar1 = has_new_height(this);
    if (bVar1) {
      iVar5 = new_height(this);
      sVar7 = google::protobuf::internal::WireFormatLite::Int32Size(iVar5);
      _i = sVar7 + 2 + _i;
    }
    bVar1 = has_concat_dim(this);
    if (bVar1) {
      uVar6 = concat_dim(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar6);
      _i = sVar7 + 2 + _i;
    }
    bVar1 = has_biasterm(this);
    if (bVar1) {
      _i = _i + 2;
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 0xff000000) != 0) {
    bVar1 = has_group(this);
    if (bVar1) {
      uVar6 = group(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar6);
      _i = sVar7 + 1 + _i;
    }
    bVar1 = has_stride(this);
    if (bVar1) {
      uVar6 = stride(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar6);
      _i = sVar7 + 1 + _i;
    }
    bVar1 = has_dropout_ratio(this);
    if (bVar1) {
      _i = _i + 5;
    }
    bVar1 = has_local_size(this);
    if (bVar1) {
      uVar6 = local_size(this);
      sVar7 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar6);
      _i = sVar7 + 1 + _i;
    }
    bVar1 = has_alpha(this);
    if (bVar1) {
      _i = _i + 5;
    }
    bVar1 = has_beta(this);
    if (bVar1) {
      _i = _i + 5;
    }
    bVar1 = has_scale(this);
    if (bVar1) {
      _i = _i + 6;
    }
    bVar1 = has_k(this);
    if (bVar1) {
      _i = _i + 6;
    }
  }
  if (((this->_has_bits_).has_bits_[1] & 7) != 0) {
    bVar1 = has_det_fg_threshold(this);
    if (bVar1) {
      _i = _i + 6;
    }
    bVar1 = has_det_bg_threshold(this);
    if (bVar1) {
      _i = _i + 6;
    }
    bVar1 = has_det_fg_fraction(this);
    if (bVar1) {
      _i = _i + 6;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t V0LayerParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.V0LayerParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .caffe.BlobProto blobs = 50;
  {
    unsigned int count = this->blobs_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->blobs(i));
    }
  }

  // repeated float blobs_lr = 51;
  {
    unsigned int count = this->blobs_lr_size();
    size_t data_size = 4UL * count;
    total_size += 2 *
                  ::google::protobuf::internal::FromIntSize(this->blobs_lr_size());
    total_size += data_size;
  }

  // repeated float weight_decay = 52;
  {
    unsigned int count = this->weight_decay_size();
    size_t data_size = 4UL * count;
    total_size += 2 *
                  ::google::protobuf::internal::FromIntSize(this->weight_decay_size());
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 255u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string type = 2;
    if (has_type()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->type());
    }

    // optional string source = 16;
    if (has_source()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->source());
    }

    // optional string meanfile = 18;
    if (has_meanfile()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->meanfile());
    }

    // optional string det_crop_mode = 59 [default = "warp"];
    if (has_det_crop_mode()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->det_crop_mode());
    }

    // optional .caffe.FillerParameter weight_filler = 5;
    if (has_weight_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->weight_filler_);
    }

    // optional .caffe.FillerParameter bias_filler = 6;
    if (has_bias_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->bias_filler_);
    }

    // optional .caffe.HDF5OutputParameter hdf5_output_param = 1001;
    if (has_hdf5_output_param()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->hdf5_output_param_);
    }

  }
  if (_has_bits_[8 / 32] & 65280u) {
    // optional uint32 num_output = 3;
    if (has_num_output()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->num_output());
    }

    // optional uint32 pad = 7 [default = 0];
    if (has_pad()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->pad());
    }

    // optional uint32 kernelsize = 8;
    if (has_kernelsize()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->kernelsize());
    }

    // optional .caffe.V0LayerParameter.PoolMethod pool = 11 [default = MAX];
    if (has_pool()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->pool());
    }

    // optional uint32 batchsize = 19;
    if (has_batchsize()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->batchsize());
    }

    // optional uint32 cropsize = 20 [default = 0];
    if (has_cropsize()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->cropsize());
    }

    // optional int32 new_width = 63 [default = 0];
    if (has_new_width()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->new_width());
    }

    // optional bool mirror = 21 [default = false];
    if (has_mirror()) {
      total_size += 2 + 1;
    }

  }
  if (_has_bits_[16 / 32] & 16711680u) {
    // optional bool shuffle_images = 64 [default = false];
    if (has_shuffle_images()) {
      total_size += 2 + 1;
    }

    // optional uint32 rand_skip = 53 [default = 0];
    if (has_rand_skip()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->rand_skip());
    }

    // optional uint32 det_context_pad = 58 [default = 0];
    if (has_det_context_pad()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->det_context_pad());
    }

    // optional int32 new_num = 60 [default = 0];
    if (has_new_num()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->new_num());
    }

    // optional int32 new_channels = 61 [default = 0];
    if (has_new_channels()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->new_channels());
    }

    // optional int32 new_height = 62 [default = 0];
    if (has_new_height()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->new_height());
    }

    // optional uint32 concat_dim = 65 [default = 1];
    if (has_concat_dim()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->concat_dim());
    }

    // optional bool biasterm = 4 [default = true];
    if (has_biasterm()) {
      total_size += 1 + 1;
    }

  }
  if (_has_bits_[24 / 32] & 4278190080u) {
    // optional uint32 group = 9 [default = 1];
    if (has_group()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->group());
    }

    // optional uint32 stride = 10 [default = 1];
    if (has_stride()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->stride());
    }

    // optional float dropout_ratio = 12 [default = 0.5];
    if (has_dropout_ratio()) {
      total_size += 1 + 4;
    }

    // optional uint32 local_size = 13 [default = 5];
    if (has_local_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->local_size());
    }

    // optional float alpha = 14 [default = 1];
    if (has_alpha()) {
      total_size += 1 + 4;
    }

    // optional float beta = 15 [default = 0.75];
    if (has_beta()) {
      total_size += 1 + 4;
    }

    // optional float scale = 17 [default = 1];
    if (has_scale()) {
      total_size += 2 + 4;
    }

    // optional float k = 22 [default = 1];
    if (has_k()) {
      total_size += 2 + 4;
    }

  }
  if (_has_bits_[32 / 32] & 7u) {
    // optional float det_fg_threshold = 54 [default = 0.5];
    if (has_det_fg_threshold()) {
      total_size += 2 + 4;
    }

    // optional float det_bg_threshold = 55 [default = 0.5];
    if (has_det_bg_threshold()) {
      total_size += 2 + 4;
    }

    // optional float det_fg_fraction = 56 [default = 0.25];
    if (has_det_fg_fraction()) {
      total_size += 2 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}